

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

void predict_with_confidence(uncertainty *d,float fx,float *fw)

{
  ftrl *pfVar1;
  float fVar2;
  
  d->pred = *fw * fx + d->pred;
  fVar2 = fw[2];
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  pfVar1 = d->b;
  d->score = (1.0 / ((fVar2 + (pfVar1->data).ftrl_beta) / (pfVar1->data).ftrl_alpha +
                    (pfVar1->data).l2_lambda)) * *(float *)(&DAT_0023cd20 + (ulong)(fx < 0.0) * 4) +
             d->score;
  return;
}

Assistant:

inline void predict_with_confidence(uncertainty& d, const float fx, float& fw)
{
  float* w = &fw;
  d.pred += w[W_XT] * fx;
  float sqrtf_ng2 = sqrtf(w[W_G2]);
  float uncertain = ((d.b.data.ftrl_beta + sqrtf_ng2) / d.b.data.ftrl_alpha + d.b.data.l2_lambda);
  d.score += (1 / uncertain) * sign(fx);
}